

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kd-tree-dense-points.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  bool bVar1;
  int iVar2;
  Options *pOVar3;
  ostream *poVar4;
  vector<PointT,_std::allocator<PointT>_> *this;
  reference piVar5;
  Bounds *core__;
  reference pvVar6;
  undefined8 *in_RSI;
  RegularContinuousLink *link;
  BlockT *block;
  int gid;
  iterator __end1;
  iterator __begin1;
  vector<int,_std::allocator<int>_> *__range1;
  vector<int,_std::allocator<int>_> gids;
  ContinuousBounds gdomain;
  vector<PointT,_std::allocator<PointT>_> points;
  ContiguousAssigner cuts_assigner;
  Master master;
  Options ops;
  char filename [512];
  int bins;
  int nblocks;
  bool help;
  communicator comm;
  environment env;
  unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_> *in_stack_ffffffffffffe378;
  vector<PointT,_std::allocator<PointT>_> *pts;
  Master *in_stack_ffffffffffffe380;
  anon_class_1_0_00000001 *in_stack_ffffffffffffe388;
  function<void_(void_*)> *in_stack_ffffffffffffe390;
  string *in_stack_ffffffffffffe3a0;
  undefined4 in_stack_ffffffffffffe3a8;
  int in_stack_ffffffffffffe3ac;
  int iVar7;
  string *in_stack_ffffffffffffe3b0;
  undefined4 in_stack_ffffffffffffe3b8;
  undefined4 in_stack_ffffffffffffe3bc;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffe3c0;
  RegularLink<diy::Bounds<float>_> *this_00;
  Options *in_stack_ffffffffffffe3c8;
  vector<PointT,_std::allocator<PointT>_> *__x;
  vector<PointT,_std::allocator<PointT>_> *in_stack_ffffffffffffe3d0;
  undefined4 in_stack_ffffffffffffe3e0;
  undefined4 in_stack_ffffffffffffe3e4;
  char (*in_stack_ffffffffffffe3e8) [512];
  Link *l;
  string *in_stack_ffffffffffffe3f0;
  allocator<char> *b;
  undefined8 in_stack_ffffffffffffe3f8;
  char s;
  Master *this_01;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_1ba0;
  vector<int,_std::allocator<int>_> *local_1b98;
  vector<int,_std::allocator<int>_> local_1b90 [7];
  vector<PointT,_std::allocator<PointT>_> *in_stack_ffffffffffffe528;
  communicator local_1a28 [10];
  char *in_stack_ffffffffffffe6d8;
  char **in_stack_ffffffffffffe840;
  int in_stack_ffffffffffffe84c;
  Options *in_stack_ffffffffffffe850;
  undefined1 in_stack_ffffffffffffea3f;
  size_t in_stack_ffffffffffffea40;
  offset_in_BlockT_to_vector<PointT,_std::allocator<PointT>_> in_stack_ffffffffffffea48;
  ContinuousBounds *in_stack_ffffffffffffea50;
  int in_stack_ffffffffffffea5c;
  Assigner *in_stack_ffffffffffffea60;
  Master *in_stack_ffffffffffffea68;
  undefined1 local_3d9 [40];
  allocator<char> local_3b1;
  string local_3b0 [47];
  undefined1 local_381 [40];
  allocator<char> local_359;
  string local_358 [47];
  allocator<char> local_329;
  string local_328 [39];
  allocator<char> local_301;
  string local_300 [47];
  allocator<char> local_2d1;
  string local_2d0 [39];
  allocator<char> local_2a9;
  string local_2a8 [608];
  undefined4 local_48;
  undefined4 local_44;
  byte local_3d;
  communicator local_30;
  undefined8 *local_10;
  int local_4;
  
  s = (char)((ulong)in_stack_ffffffffffffe3f8 >> 0x38);
  local_4 = 0;
  local_10 = in_RSI;
  diy::mpi::environment::environment
            ((environment *)in_stack_ffffffffffffe380,
             (int)((ulong)in_stack_ffffffffffffe378 >> 0x20),(char **)0x111b2d);
  diy::mpi::communicator::communicator((communicator *)in_stack_ffffffffffffe380);
  local_44 = 1;
  local_48 = 0x80;
  opts::Options::Options((Options *)in_stack_ffffffffffffe380);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe3c0,
             (char *)CONCAT44(in_stack_ffffffffffffe3bc,in_stack_ffffffffffffe3b8),
             (allocator<char> *)in_stack_ffffffffffffe3b0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe3c0,
             (char *)CONCAT44(in_stack_ffffffffffffe3bc,in_stack_ffffffffffffe3b8),
             (allocator<char> *)in_stack_ffffffffffffe3b0);
  opts::Option<int>(s,in_stack_ffffffffffffe3f0,(int *)in_stack_ffffffffffffe3e8,
                    (string *)CONCAT44(in_stack_ffffffffffffe3e4,in_stack_ffffffffffffe3e0));
  opts::Options::operator>>((Options *)in_stack_ffffffffffffe380,in_stack_ffffffffffffe378);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe3c0,
             (char *)CONCAT44(in_stack_ffffffffffffe3bc,in_stack_ffffffffffffe3b8),
             (allocator<char> *)in_stack_ffffffffffffe3b0);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe3c0,
             (char *)CONCAT44(in_stack_ffffffffffffe3bc,in_stack_ffffffffffffe3b8),
             (allocator<char> *)in_stack_ffffffffffffe3b0);
  opts::Option<char[512]>
            (s,in_stack_ffffffffffffe3f0,in_stack_ffffffffffffe3e8,
             (string *)CONCAT44(in_stack_ffffffffffffe3e4,in_stack_ffffffffffffe3e0));
  opts::Options::operator>>((Options *)in_stack_ffffffffffffe380,in_stack_ffffffffffffe378);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe3c0,
             (char *)CONCAT44(in_stack_ffffffffffffe3bc,in_stack_ffffffffffffe3b8),
             (allocator<char> *)in_stack_ffffffffffffe3b0);
  this_01 = (Master *)local_381;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe3c0,
             (char *)CONCAT44(in_stack_ffffffffffffe3bc,in_stack_ffffffffffffe3b8),
             (allocator<char> *)in_stack_ffffffffffffe3b0);
  opts::Option<int>(s,in_stack_ffffffffffffe3f0,(int *)in_stack_ffffffffffffe3e8,
                    (string *)CONCAT44(in_stack_ffffffffffffe3e4,in_stack_ffffffffffffe3e0));
  pOVar3 = opts::Options::operator>>((Options *)in_stack_ffffffffffffe380,in_stack_ffffffffffffe378)
  ;
  b = &local_3b1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe3c0,
             (char *)CONCAT44(in_stack_ffffffffffffe3bc,in_stack_ffffffffffffe3b8),
             (allocator<char> *)in_stack_ffffffffffffe3b0);
  l = (Link *)local_3d9;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe3c0,
             (char *)CONCAT44(in_stack_ffffffffffffe3bc,in_stack_ffffffffffffe3b8),
             (allocator<char> *)in_stack_ffffffffffffe3b0);
  opts::Option<bool>((char)((uint)in_stack_ffffffffffffe3bc >> 0x18),in_stack_ffffffffffffe3b0,
                     (bool *)CONCAT44(in_stack_ffffffffffffe3ac,in_stack_ffffffffffffe3a8),
                     in_stack_ffffffffffffe3a0);
  opts::Options::operator>>((Options *)in_stack_ffffffffffffe380,in_stack_ffffffffffffe378);
  std::unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_>::~unique_ptr
            ((unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_> *)
             in_stack_ffffffffffffe380);
  std::__cxx11::string::~string((string *)(local_3d9 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_3d9);
  std::__cxx11::string::~string(local_3b0);
  std::allocator<char>::~allocator(&local_3b1);
  std::unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_>::~unique_ptr
            ((unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_> *)
             in_stack_ffffffffffffe380);
  std::__cxx11::string::~string((string *)(local_381 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_381);
  std::__cxx11::string::~string(local_358);
  std::allocator<char>::~allocator(&local_359);
  std::unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_>::~unique_ptr
            ((unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_> *)
             in_stack_ffffffffffffe380);
  std::__cxx11::string::~string(local_328);
  std::allocator<char>::~allocator(&local_329);
  std::__cxx11::string::~string(local_300);
  std::allocator<char>::~allocator(&local_301);
  std::unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_>::~unique_ptr
            ((unique_ptr<opts::BasicOption,_std::default_delete<opts::BasicOption>_> *)
             in_stack_ffffffffffffe380);
  std::__cxx11::string::~string(local_2d0);
  std::allocator<char>::~allocator(&local_2d1);
  std::__cxx11::string::~string(local_2a8);
  std::allocator<char>::~allocator(&local_2a9);
  bVar1 = opts::Options::parse
                    (in_stack_ffffffffffffe850,in_stack_ffffffffffffe84c,in_stack_ffffffffffffe840);
  if ((bVar1) && ((local_3d & 1) == 0)) {
    diy::mpi::communicator::communicator(local_1a28,&local_30);
    std::function<void*()>::function<main::__0,void>
              ((function<void_*()> *)in_stack_ffffffffffffe390,in_stack_ffffffffffffe388);
    std::function<void(void*)>::function<main::__1,void>
              (in_stack_ffffffffffffe390,in_stack_ffffffffffffe388);
    this_00 = (RegularLink<diy::Bounds<float>_> *)0x0;
    std::function<void_(const_void_*,_diy::BinaryBuffer_&)>::function
              ((function<void_(const_void_*,_diy::BinaryBuffer_&)> *)in_stack_ffffffffffffe380,
               in_stack_ffffffffffffe378);
    std::function<void_(void_*,_diy::BinaryBuffer_&)>::function
              ((function<void_(void_*,_diy::BinaryBuffer_&)> *)in_stack_ffffffffffffe380,
               in_stack_ffffffffffffe378);
    this = (vector<PointT,_std::allocator<PointT>_> *)operator_new(0x10);
    diy::Master::QueueSizePolicy::QueueSizePolicy
              ((QueueSizePolicy *)in_stack_ffffffffffffe380,(size_t)in_stack_ffffffffffffe378);
    in_stack_ffffffffffffe380 = (Master *)&stack0xffffffffffffe568;
    pts = (vector<PointT,_std::allocator<PointT>_> *)0x0;
    __x = this;
    diy::Master::Master((Master *)master.mt_gen._M_x[0xe0],(communicator *)master.mt_gen._M_x[0xdf],
                        master.mt_gen._M_x[0xde]._4_4_,(int)master.mt_gen._M_x[0xde],
                        (CreateBlock *)master.mt_gen._M_x[0xdd],
                        (DestroyBlock *)master.mt_gen._M_x[0xdc],
                        (ExternalStorage *)master.mt_gen._M_x[0xe2],
                        (SaveBlock *)master.mt_gen._M_x[0xe3],(LoadBlock *)master.mt_gen._M_x[0xe4],
                        (QueuePolicy *)master.mt_gen._M_x[0xe5]);
    std::function<void_(void_*,_diy::BinaryBuffer_&)>::~function
              ((function<void_(void_*,_diy::BinaryBuffer_&)> *)0x1123cd);
    std::function<void_(const_void_*,_diy::BinaryBuffer_&)>::~function
              ((function<void_(const_void_*,_diy::BinaryBuffer_&)> *)0x1123da);
    std::function<void_(void_*)>::~function((function<void_(void_*)> *)0x1123e7);
    std::function<void_*()>::~function((function<void_*()> *)0x1123f4);
    diy::mpi::communicator::~communicator((communicator *)0x112401);
    iVar2 = diy::mpi::communicator::size(&local_30);
    diy::ContiguousAssigner::Assigner
              ((ContiguousAssigner *)in_stack_ffffffffffffe380,(int)((ulong)pts >> 0x20),(int)pts);
    read_csv(in_stack_ffffffffffffe6d8);
    std::vector<PointT,_std::allocator<PointT>_>::vector(in_stack_ffffffffffffe3d0,__x);
    compute_bounds(in_stack_ffffffffffffe528);
    std::vector<PointT,_std::allocator<PointT>_>::~vector(this);
    std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x11248d);
    diy::mpi::communicator::rank(&local_30);
    diy::ContiguousAssigner::local_gids
              ((ContiguousAssigner *)in_stack_ffffffffffffe3b0,in_stack_ffffffffffffe3ac,
               (vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffe3a0);
    local_1b98 = local_1b90;
    local_1ba0._M_current =
         (int *)std::vector<int,_std::allocator<int>_>::begin
                          ((vector<int,_std::allocator<int>_> *)pts);
    std::vector<int,_std::allocator<int>_>::end((vector<int,_std::allocator<int>_> *)pts);
    while (bVar1 = __gnu_cxx::operator!=
                             ((__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                              in_stack_ffffffffffffe380,
                              (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                              pts), bVar1) {
      piVar5 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
               operator*(&local_1ba0);
      iVar7 = *piVar5;
      core__ = (Bounds *)operator_new(0x18);
      memset(core__,0,0x18);
      BlockT::BlockT((BlockT *)0x112555);
      pvVar6 = std::vector<int,_std::allocator<int>_>::operator[](local_1b90,0);
      if (iVar7 == *pvVar6) {
        BlockT::AddPoints((BlockT *)in_stack_ffffffffffffe380,pts);
      }
      operator_new(0x1b8);
      diy::RegularLink<diy::Bounds<float>_>::RegularLink
                (this_00,iVar2,core__,(Bounds *)CONCAT44(iVar7,in_stack_ffffffffffffe3a8));
      diy::Master::add(this_01,(int)((ulong)pOVar3 >> 0x20),b,l);
      __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
                (&local_1ba0);
    }
    diy::kdtree<BlockT,PointT>
              (in_stack_ffffffffffffea68,in_stack_ffffffffffffea60,in_stack_ffffffffffffea5c,
               in_stack_ffffffffffffea50,in_stack_ffffffffffffea48,in_stack_ffffffffffffea40,
               (bool)in_stack_ffffffffffffea3f);
    local_4 = 0;
    std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)this);
    diy::Bounds<float>::~Bounds((Bounds<float> *)in_stack_ffffffffffffe380);
    std::vector<PointT,_std::allocator<PointT>_>::~vector(this);
    diy::ContiguousAssigner::~ContiguousAssigner((ContiguousAssigner *)0x1127d2);
    diy::Master::~Master(in_stack_ffffffffffffe380);
  }
  else {
    iVar2 = diy::mpi::communicator::rank(&local_30);
    if (iVar2 == 0) {
      poVar4 = std::operator<<((ostream *)&std::cout,"Usage: ");
      poVar4 = std::operator<<(poVar4,(char *)*local_10);
      std::operator<<(poVar4," [OPTIONS]\n");
      std::operator<<((ostream *)&std::cout,
                      "Tests Kd tree with dataset where most points are located very closely.\n");
      opts::operator<<(poVar4,in_stack_ffffffffffffe3c8);
    }
    local_4 = 1;
  }
  opts::Options::~Options((Options *)in_stack_ffffffffffffe380);
  diy::mpi::communicator::~communicator((communicator *)0x11283e);
  diy::mpi::environment::~environment((environment *)0x11284b);
  return local_4;
}

Assistant:

int main (int argc, char* argv[])
{
  diy::mpi::environment env(argc, argv);
  diy::mpi::communicator comm;

  bool help;
  int nblocks = 1;
  int bins = 128;
  char filename[512];

  // get command line arguments
  using namespace opts;
  Options ops;
  ops
    >> Option('b', "blocks",    nblocks,        "number of blocks")
    >> Option('f', "filename",  filename,       "csv of points")
    >> Option('n', "bins",      bins,           "number of bins")
    >> Option('h', "help",      help,           "show help")
    ;

  if (!ops.parse(argc,argv) || help)
  {
    if (comm.rank() == 0)
    {
      std::cout << "Usage: " << argv[0] << " [OPTIONS]\n";
      std::cout << "Tests Kd tree with dataset where most points are located very closely.\n";
      std::cout << ops;
    }
    return 1;
  }

  diy::Master master(comm, 1, -1, []() { return static_cast<void*>(new BlockT); },
    [](void* b) { delete static_cast<BlockT*>(b); });

  diy::ContiguousAssigner cuts_assigner(comm.size(), nblocks);

  auto points = read_csv(filename);

  const auto gdomain = compute_bounds(points);

  std::vector<int> gids;
  cuts_assigner.local_gids(comm.rank(), gids);
  for (const int gid : gids)
  {
    auto block = new BlockT();
    if (gid == gids[0])
    {
      block->AddPoints(std::move(points));
    }
    auto link = new diy::RegularContinuousLink(3, gdomain, gdomain);
    master.add(gid, block, link);
  }

  diy::kdtree(master, cuts_assigner, 3, gdomain, &BlockT::Points, bins);

  return 0;
}